

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.cpp
# Opt level: O0

bool polyscope::anon_unknown_5::hasExtension(string *str,string *ext)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  string *psVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RSI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  _func_int_int *in_stack_ffffffffffffff80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff88;
  undefined1 local_1;
  
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
            (in_RSI,in_RDI,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
            (in_RSI,in_RDI,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  uVar2 = std::__cxx11::string::length();
  uVar3 = std::__cxx11::string::length();
  if (uVar2 < uVar3) {
    local_1 = false;
  }
  else {
    lVar4 = std::__cxx11::string::length();
    lVar5 = std::__cxx11::string::length();
    uVar2 = lVar4 - lVar5;
    psVar6 = (string *)std::__cxx11::string::length();
    iVar1 = std::__cxx11::string::compare((ulong)in_RDI._M_current,uVar2,psVar6);
    local_1 = iVar1 == 0;
  }
  return local_1;
}

Assistant:

bool hasExtension(std::string str, std::string ext) {

  std::transform(str.begin(), str.end(), str.begin(), ::tolower);
  std::transform(ext.begin(), ext.end(), ext.begin(), ::tolower);

  if (str.length() >= ext.length()) {
    return (0 == str.compare(str.length() - ext.length(), ext.length(), ext));
  } else {
    return false;
  }
}